

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderV3fAttribute(ImfHeader *hdr,char *name,float *x,float *y,float *z)

{
  TypedAttribute<Imath_3_2::Vec3<float>_> *this;
  Vec3<float> *pVVar1;
  float *in_RCX;
  float *in_RDX;
  ImfHeader *in_RDI;
  Header *in_R8;
  exception *e;
  V3f *v;
  char *in_stack_ffffffffffffffc8;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                   (in_R8,in_stack_ffffffffffffffc8);
  pVVar1 = Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::value(this);
  *in_RDX = pVVar1->x;
  *in_RCX = pVVar1->y;
  *(float *)&(in_R8->_map)._M_t._M_impl = pVVar1->z;
  return 1;
}

Assistant:

int
ImfHeaderV3fAttribute (
    const ImfHeader* hdr, const char name[], float* x, float* y, float* z)
{
    try
    {
        const V3f& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;
        *z = v.z;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}